

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse::GetAsyncCommandResponse
          (GetAsyncCommandResponse *this)

{
  GetAsyncCommandResponse *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GetAsyncCommandResponse_009c3168;
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>::CopyablePtr
            (&this->setup_tracing_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource>::
  CopyablePtr(&this->setup_data_source_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StartDataSource>::
  CopyablePtr(&this->start_data_source_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource>::CopyablePtr
            (&this->stop_data_source_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_Flush>::CopyablePtr
            (&this->flush_);
  protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_ClearIncrementalState>::
  CopyablePtr(&this->clear_incremental_state_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<8UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

GetAsyncCommandResponse::GetAsyncCommandResponse() = default;